

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsMaxRelRate(uint arg_count,long *arg_array)

{
  long local_38 [4];
  long *local_18;
  long *arg_array_local;
  uint arg_count_local;
  
  local_18 = arg_array;
  arg_array_local._4_4_ = arg_count;
  if (target_driver < 3) {
    WriteByte(0xf9);
  }
  else {
    local_38[2] = 0x88;
    local_38[3] = 0xf;
    Macro_smpsFMICommand(2,local_38 + 2);
    local_38[0] = 0x8c;
    local_38[1] = 0xf;
    Macro_smpsFMICommand(2,local_38);
  }
  return;
}

Assistant:

static void Macro_smpsMaxRelRate(unsigned int arg_count, long arg_array[])
{
	(void)arg_count;
	(void)arg_array;

	if (target_driver >= 3)
	{
		Macro_smpsFMICommand(2, (long[]){0x88, 0x0F});
		Macro_smpsFMICommand(2, (long[]){0x8C, 0x0F});
	}
	else
	{
		WriteByte(0xF9);
	}
}